

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

void stringify_server_ID(uchar *ID,char *buffer,int len)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *__format;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  version_3_format_ID *id3;
  
  iVar3 = version_of_format_ID(ID);
  if (iVar3 == 2) {
    if (len < 0x4e) {
      return;
    }
    uVar5 = get_rep_len_format_ID(ID);
    bVar1 = *ID;
    uVar8 = *(uint *)(ID + 4);
    uVar2 = *(uint *)(ID + 8);
    uVar7 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)
    ;
    uVar8 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    __format = "<ID ver=%d, rep_len %d, hash1 %x, hash2 %x>\n";
    uVar6 = (ulong)uVar5;
  }
  else {
    if (iVar3 != 1) {
      if (iVar3 != 0) {
        if (len < 0x1e) {
          return;
        }
        snprintf(buffer,(ulong)(uint)len,"<Unknown format version %d\n",(ulong)*ID);
        return;
      }
      if (len < 0x10) {
        return;
      }
      iVar3 = 0;
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        iVar4 = snprintf(buffer + iVar3,(long)(len - iVar3),"%2x",(ulong)ID[lVar9]);
        iVar3 = iVar4 + iVar3;
      }
      return;
    }
    if (len < 0x4e) {
      return;
    }
    uVar8 = *(uint *)(ID + 4);
    uVar6 = (ulong)ID[1];
    bVar1 = *ID;
    uVar7 = (ulong)(ushort)(*(ushort *)(ID + 2) << 8 | *(ushort *)(ID + 2) >> 8);
    uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    __format = "<ID ver=%d, salt %d, port %d, IP_addr %x, formatID %d>\n";
  }
  snprintf(buffer,(ulong)(uint)len,__format,(ulong)bVar1,uVar6,uVar7,(ulong)uVar8);
  return;
}

Assistant:

extern void
stringify_server_ID(unsigned char *ID, char *buffer, int len)
{
    int id_size = 8;
    int point = 0;
    int i;
    switch (version_of_format_ID(ID)) {
    case 0:
	if (len < id_size * 2) break;
	for (i = 0; i < id_size; i++) {
	    point += snprintf(&buffer[point], len - point, "%2x", ID[i]);
	}
	break;
    case 1:{
	version_1_format_ID id1;
	memcpy(&id1, ID, 10);
	if (len < 3+3+6+10+6+50) /* approx size */ return;
	snprintf(buffer, len, "<ID ver=%d, salt %d, port %d, IP_addr %x, formatID %d>\n",
	       id1.version, id1.salt, ntohs(id1.port),
	       ntohl(id1.IP_addr), ntohs(id1.format_identifier));
	    break;
	}
    case 2:{
	version_3_format_ID *id3 = (version_3_format_ID*)ID;
	if (len < 3+3+6+10+6+50) /* approx size */ return;
	int rep_len = get_rep_len_format_ID(ID);
	snprintf(buffer, len, "<ID ver=%d, rep_len %d, hash1 %x, hash2 %x>\n",
	       id3->version, rep_len,
	       ntohl(id3->hash1), ntohl(id3->hash2));
	    break;
	}
    default:
	if (len < 30) return;
	snprintf(buffer, len, "<Unknown format version %d\n",
	       *((unsigned char *) ID));
	break;
    }
}